

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

string * __thiscall
google::protobuf::StrCat_abi_cxx11_
          (string *__return_storage_ptr__,protobuf *this,AlphaNum *a,AlphaNum *b)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  Append2((__return_storage_ptr__->_M_dataplus)._M_p,(AlphaNum *)this,a);
  return __return_storage_ptr__;
}

Assistant:

std::string StrCat(const AlphaNum &a, const AlphaNum &b) {
  std::string result;
  result.resize(a.size() + b.size());
  char *const begin = &*result.begin();
  char *out = Append2(begin, a, b);
  GOOGLE_DCHECK_EQ(out, begin + result.size());
  return result;
}